

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O1

void tbx_destroy(tbx_t *tbx)

{
  kh_s2i_t *h;
  byte bVar1;
  uint uVar2;
  
  h = (kh_s2i_t *)tbx->dict;
  if ((h != (kh_s2i_t *)0x0) && (h->n_buckets != 0)) {
    bVar1 = 0;
    uVar2 = 0;
    do {
      if ((h->flags[uVar2 >> 4] >> (bVar1 & 0x1e) & 3) == 0) {
        free(h->keys[uVar2]);
      }
      uVar2 = uVar2 + 1;
      bVar1 = bVar1 + 2;
    } while (uVar2 != h->n_buckets);
  }
  hts_idx_destroy(tbx->idx);
  kh_destroy_s2i(h);
  free(tbx);
  return;
}

Assistant:

void tbx_destroy(tbx_t *tbx)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d != NULL)
    {
        khint_t k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
    }
    hts_idx_destroy(tbx->idx);
    kh_destroy(s2i, d);
    free(tbx);
}